

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

Mat * __thiscall ncnn::Mat::channel(Mat *__return_storage_ptr__,Mat *this,int _c)

{
  if (this->dims == 3) {
    Mat(__return_storage_ptr__,this->w,this->h,
        (void *)((long)_c * this->cstep * this->elemsize + (long)this->data),this->elemsize,
        this->elempack,this->allocator);
  }
  else {
    Mat(__return_storage_ptr__,this->w,this->h,this->d,
        (void *)((long)_c * this->cstep * this->elemsize + (long)this->data),this->elemsize,
        this->elempack,this->allocator);
    __return_storage_ptr__->cstep = (long)this->h * (long)this->w;
  }
  return __return_storage_ptr__;
}

Assistant:

inline const Mat Mat::channel(int _c) const
{
    if (dims == 3)
        return Mat(w, h, (unsigned char*)data + cstep * _c * elemsize, elemsize, elempack, allocator);

    // if (dims == 4)
    Mat m(w, h, d, (unsigned char*)data + cstep * _c * elemsize, elemsize, elempack, allocator);
    m.cstep = (size_t)w * h;
    return m;
}